

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O1

Name __thiscall
wasm::Outlining::addOutlinedFunction
          (Outlining *this,Module *module,RepeatedSubstring *substring,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *exprs)

{
  uint uVar1;
  Signature sig_00;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *pvVar2;
  ulong uVar3;
  string_view sVar4;
  Name name;
  HeapType local_98;
  string_view local_90;
  Module *local_80;
  StackSignature local_78;
  undefined1 auStack_58 [8];
  StackSignature sig;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  
  uVar1 = *(substring->StartIndices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)uVar1;
  pvVar2 = exprs;
  auStack_58 = (undefined1  [8])&sig.results;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"outline$","");
  sVar4._M_str = (char *)0x0;
  sVar4._M_len = (size_t)auStack_58;
  sVar4 = IString::interned((IString *)sig.params.id,sVar4,SUB81(pvVar2,0));
  local_90 = (string_view)Names::getValidFunctionName(module,(Name)sVar4);
  if (auStack_58 != (undefined1  [8])&sig.results) {
    operator_delete((void *)auStack_58,CONCAT44(sig.results.id._4_4_,(undefined4)sig.results.id) + 1
                   );
  }
  auStack_58 = (undefined1  [8])0x0;
  sig.params.id = 0;
  sig.results.id._0_4_ = 0;
  local_80 = module;
  if (uVar1 < substring->Length + uVar1) {
    do {
      StackSignature::StackSignature
                (&local_78,
                 (exprs->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar3]);
      StackSignature::operator+=((StackSignature *)auStack_58,&local_78);
      uVar3 = uVar3 + 1;
    } while (uVar3 < substring->Length + uVar1);
  }
  sig_00.results.id = sig.params.id;
  sig_00.params.id = (uintptr_t)auStack_58;
  HeapType::HeapType(&local_98,sig_00);
  sVar4 = local_90;
  local_78.params.id = 0;
  local_78.results.id = 0;
  local_78._16_8_ = 0;
  name.super_IString.str._M_str = (char *)local_90._M_len;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name,(HeapType)local_90._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_98.id,(Expression *)&local_78)
  ;
  Module::addFunction(local_80,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &local_38);
  if (local_38._M_head_impl != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
  }
  local_38._M_head_impl = (Function *)0x0;
  if ((void *)local_78.params.id != (void *)0x0) {
    operator_delete((void *)local_78.params.id,local_78._16_8_ - local_78.params.id);
  }
  return (IString)(IString)sVar4;
}

Assistant:

Name addOutlinedFunction(Module* module,
                           const SuffixTree::RepeatedSubstring& substring,
                           const std::vector<Expression*>& exprs) {
    auto startIdx = substring.StartIndices[0];
    // The outlined functions can be named anything.
    Name func = Names::getValidFunctionName(*module, std::string("outline$"));
    // Calculate the function signature for the outlined sequence.
    StackSignature sig;
    for (uint32_t exprIdx = startIdx; exprIdx < startIdx + substring.Length;
         exprIdx++) {
      sig += StackSignature(exprs[exprIdx]);
    }
    module->addFunction(
      Builder::makeFunction(func, Signature(sig.params, sig.results), {}));
    return func;
  }